

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O2

void adios2::core::engine::ssc::SerializeAttributes(IO *input,Buffer *output)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  long lVar3;
  void *__src;
  undefined8 uVar4;
  long lVar5;
  Attribute *pAVar6;
  size_t sVar7;
  string *psVar8;
  long *plVar9;
  allocator local_23a;
  allocator local_239;
  IO *local_238;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_238 = input;
  lVar5 = adios2::core::IO::GetAttributes_abi_cxx11_();
  plVar9 = (long *)(lVar5 + 0x10);
  do {
    plVar9 = (long *)*plVar9;
    if (plVar9 == (long *)0x0) {
      return;
    }
    lVar5 = *(long *)output->m_Buffer;
    Buffer::resize(output,lVar5 + 0x400);
    if (0xe < *(int *)(plVar9[5] + 0x28) - 1U) goto LAB_0013ee90;
    lVar3 = (long)(plVar9 + 1);
    switch(*(int *)(plVar9[5] + 0x28)) {
    case 1:
      std::__cxx11::string::string(local_230,"",&local_239);
      std::__cxx11::string::string(local_90,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<signed_char>(local_238,lVar3,local_230,local_90);
      std::__cxx11::string::~string(local_90);
      goto LAB_0013e6d1;
    case 2:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_b0;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<short>(local_238,lVar3,local_230,psVar8);
      goto LAB_0013eac6;
    case 3:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_d0;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<int>(local_238,lVar3,local_230,psVar8);
      goto LAB_0013ec60;
    case 4:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_f0;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<long>(local_238,lVar3,local_230,psVar8);
      break;
    case 5:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_110;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<unsigned_char>(local_238,lVar3,local_230,psVar8);
      goto LAB_0013e6c3;
    case 6:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_130;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<unsigned_short>(local_238,lVar3,local_230,psVar8);
LAB_0013eac6:
      std::__cxx11::string::~string(psVar8);
      std::__cxx11::string::~string(local_230);
      output->m_Buffer[lVar5] = 'B';
      *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
      *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
      memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
      lVar5 = lVar5 + 3 + *(long *)(pAVar6 + 0x10);
      if (pAVar6[0x38] == (Attribute)0x1) {
        puVar2 = output->m_Buffer;
        puVar1 = puVar2 + lVar5;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        *(undefined2 *)(puVar2 + lVar5 + 8) = *(undefined2 *)(pAVar6 + 0x58);
        lVar5 = lVar5 + 10;
        goto LAB_0013ee90;
      }
      goto LAB_0013ee64;
    case 7:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_150;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<unsigned_int>(local_238,lVar3,local_230,psVar8);
LAB_0013ec60:
      std::__cxx11::string::~string(psVar8);
      std::__cxx11::string::~string(local_230);
      output->m_Buffer[lVar5] = 'B';
      *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
      *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
      memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
      lVar5 = lVar5 + 3 + *(long *)(pAVar6 + 0x10);
      if (pAVar6[0x38] == (Attribute)0x1) {
        puVar2 = output->m_Buffer;
        puVar1 = puVar2 + lVar5;
        puVar1[0] = '\x04';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        *(undefined4 *)(puVar2 + lVar5 + 8) = *(undefined4 *)(pAVar6 + 0x58);
LAB_0013ee5e:
        lVar5 = lVar5 + 0xc;
        goto LAB_0013ee90;
      }
      goto LAB_0013ee64;
    case 8:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_170;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<unsigned_long>(local_238,lVar3,local_230,psVar8);
      break;
    case 9:
      std::__cxx11::string::string(local_230,"",&local_239);
      std::__cxx11::string::string(local_190,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<float>(local_238,lVar3,local_230,local_190);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_230);
      output->m_Buffer[lVar5] = 'B';
      *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
      *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
      memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
      lVar5 = lVar5 + 3 + *(long *)(pAVar6 + 0x10);
      if (pAVar6[0x38] != (Attribute)0x1) goto LAB_0013ee64;
      puVar2 = output->m_Buffer;
      puVar1 = puVar2 + lVar5;
      puVar1[0] = '\x04';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined4 *)(puVar2 + lVar5 + 8) = *(undefined4 *)(pAVar6 + 0x58);
      goto LAB_0013ee5e;
    case 10:
      std::__cxx11::string::string(local_230,"",&local_239);
      std::__cxx11::string::string(local_1b0,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<double>(local_238,lVar3,local_230,local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string(local_230);
      output->m_Buffer[lVar5] = 'B';
      *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
      *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
      memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
      lVar5 = lVar5 + 3 + *(long *)(pAVar6 + 0x10);
      if (pAVar6[0x38] != (Attribute)0x1) goto LAB_0013ee64;
      puVar2 = output->m_Buffer;
      puVar1 = puVar2 + lVar5;
      puVar1[0] = '\b';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)(puVar2 + lVar5 + 8) = *(undefined8 *)(pAVar6 + 0x58);
      goto LAB_0013ea27;
    case 0xb:
      std::__cxx11::string::string(local_230,"",&local_239);
      std::__cxx11::string::string(local_1d0,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<long_double>(local_238,lVar3,local_230,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_230);
      output->m_Buffer[lVar5] = 'B';
      *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
      *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
      memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
      lVar5 = lVar5 + 3 + *(long *)(pAVar6 + 0x10);
      if (pAVar6[0x38] != (Attribute)0x1) goto LAB_0013ee64;
      puVar2 = output->m_Buffer;
      puVar1 = puVar2 + lVar5;
      puVar1[0] = '\x10';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(unkbyte10 *)(puVar2 + lVar5 + 8) = *(unkbyte10 *)(pAVar6 + 0x60);
LAB_0013ed96:
      lVar5 = lVar5 + 0x18;
      goto LAB_0013ee90;
    case 0xc:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_1f0;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<std::complex<float>>
                         (local_238,lVar3,local_230,psVar8);
      break;
    case 0xd:
      std::__cxx11::string::string(local_230,"",&local_239);
      std::__cxx11::string::string(local_210,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<std::complex<double>>
                         (local_238,lVar3,local_230,local_210);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_230);
      output->m_Buffer[lVar5] = 'B';
      *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
      *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
      memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
      lVar5 = lVar5 + 3 + *(long *)(pAVar6 + 0x10);
      if (pAVar6[0x38] == (Attribute)0x1) {
        puVar2 = output->m_Buffer;
        puVar1 = puVar2 + lVar5;
        puVar1[0] = '\x10';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        uVar4 = *(undefined8 *)(pAVar6 + 0x60);
        puVar2 = puVar2 + lVar5 + 8;
        *(undefined8 *)puVar2 = *(undefined8 *)(pAVar6 + 0x58);
        *(undefined8 *)(puVar2 + 8) = uVar4;
        goto LAB_0013ed96;
      }
      goto LAB_0013ee64;
    case 0xe:
      std::__cxx11::string::string(local_230,"",&local_239);
      std::__cxx11::string::string(local_50,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<std::__cxx11::string>
                         (local_238,lVar3,local_230,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_230);
      output->m_Buffer[lVar5] = 'B';
      *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
      *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
      memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
      lVar3 = *(long *)(pAVar6 + 0x10);
      sVar7 = *(size_t *)(pAVar6 + 0x60);
      puVar1 = output->m_Buffer;
      *(size_t *)(puVar1 + lVar3 + lVar5 + 0xb + -8) = sVar7;
      memcpy(puVar1 + lVar3 + lVar5 + 0xb,*(void **)(pAVar6 + 0x58),sVar7);
      lVar5 = lVar5 + lVar3 + 0xb + *(long *)(pAVar6 + 0x60);
      goto LAB_0013ee90;
    case 0xf:
      std::__cxx11::string::string(local_230,"",&local_239);
      psVar8 = local_70;
      std::__cxx11::string::string(psVar8,"/",&local_23a);
      pAVar6 = adios2::core::IO::InquireAttribute<char>(local_238,lVar3,local_230,psVar8);
LAB_0013e6c3:
      std::__cxx11::string::~string(psVar8);
LAB_0013e6d1:
      std::__cxx11::string::~string(local_230);
      output->m_Buffer[lVar5] = 'B';
      *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
      *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
      memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
      lVar5 = lVar5 + 3 + *(long *)(pAVar6 + 0x10);
      if (pAVar6[0x38] == (Attribute)0x1) {
        puVar2 = output->m_Buffer;
        puVar1 = puVar2 + lVar5;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        *(Attribute *)(puVar2 + lVar5 + 8) = pAVar6[0x58];
        lVar5 = lVar5 + 9;
        goto LAB_0013ee90;
      }
      goto LAB_0013ee64;
    }
    std::__cxx11::string::~string(psVar8);
    std::__cxx11::string::~string(local_230);
    output->m_Buffer[lVar5] = 'B';
    *(Attribute *)(output->m_Buffer + lVar5 + 1) = pAVar6[0x28];
    *(Attribute *)(output->m_Buffer + lVar5 + 2) = pAVar6[0x10];
    memcpy(output->m_Buffer + lVar5 + 3,*(void **)(pAVar6 + 8),*(size_t *)(pAVar6 + 0x10));
    lVar5 = lVar5 + 3 + *(long *)(pAVar6 + 0x10);
    if (pAVar6[0x38] == (Attribute)0x1) {
      puVar2 = output->m_Buffer;
      puVar1 = puVar2 + lVar5;
      puVar1[0] = '\b';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)(puVar2 + lVar5 + 8) = *(undefined8 *)(pAVar6 + 0x58);
LAB_0013ea27:
      lVar5 = lVar5 + 0x10;
    }
    else {
LAB_0013ee64:
      __src = *(void **)(pAVar6 + 0x40);
      sVar7 = *(long *)(pAVar6 + 0x48) - (long)__src;
      puVar1 = output->m_Buffer;
      *(size_t *)(puVar1 + lVar5) = sVar7;
      memcpy((size_t *)((long)(puVar1 + lVar5) + 8),__src,sVar7);
      lVar5 = lVar5 + sVar7 + 8;
    }
LAB_0013ee90:
    *(long *)output->m_Buffer = lVar5;
  } while( true );
}

Assistant:

void SerializeAttributes(IO &input, Buffer &output)
{
    const auto &attributeMap = input.GetAttributes();
    for (const auto &attributePair : attributeMap)
    {
        uint64_t pos = output.value<uint64_t>();
        output.resize(pos + 1024);

        if (attributePair.second->m_Type == DataType::String)
        {
            const auto &attribute = input.InquireAttribute<std::string>(attributePair.first);
            output[pos] = 66;
            ++pos;
            output[pos] = static_cast<uint8_t>(attribute->m_Type);
            ++pos;
            output[pos] = static_cast<uint8_t>(attribute->m_Name.size());
            ++pos;
            std::memcpy(output.data(pos), attribute->m_Name.data(), attribute->m_Name.size());
            pos += attribute->m_Name.size();
            output.value<uint64_t>(pos) = attribute->m_DataSingleValue.size();
            pos += 8;
            std::memcpy(output.data(pos), attribute->m_DataSingleValue.data(),
                        attribute->m_DataSingleValue.size());
            pos += attribute->m_DataSingleValue.size();
        }
#define declare_type(T)                                                                            \
    else if (attributePair.second->m_Type == helper::GetDataType<T>())                             \
    {                                                                                              \
        const auto &attribute = input.InquireAttribute<T>(attributePair.first);                    \
        output[pos] = 66;                                                                          \
        ++pos;                                                                                     \
        output[pos] = static_cast<uint8_t>(attribute->m_Type);                                     \
        ++pos;                                                                                     \
        output[pos] = static_cast<uint8_t>(attribute->m_Name.size());                              \
        ++pos;                                                                                     \
        std::memcpy(output.data(pos), attribute->m_Name.data(), attribute->m_Name.size());         \
        pos += attribute->m_Name.size();                                                           \
        if (attribute->m_IsSingleValue)                                                            \
        {                                                                                          \
            output.value<uint64_t>(pos) = sizeof(T);                                               \
            pos += 8;                                                                              \
            output.value<T>(pos) = attribute->m_DataSingleValue;                                   \
            pos += sizeof(T);                                                                      \
        }                                                                                          \
        else                                                                                       \
        {                                                                                          \
            uint64_t size = sizeof(T) * attribute->m_DataArray.size();                             \
            output.value<uint64_t>(pos) = size;                                                    \
            pos += 8;                                                                              \
            std::memcpy(output.data(pos), attribute->m_DataArray.data(), size);                    \
            pos += size;                                                                           \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
        output.value<uint64_t>() = pos;
    }
}